

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O3

void ncnn::convolution_transform_kernel_packed_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  undefined4 *puVar4;
  ulong uVar5;
  undefined4 *puVar6;
  uint _w;
  ulong uVar7;
  long lVar8;
  undefined4 *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Mat weight_data_r2;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,weight_data,_w,num_input,num_output,(Allocator *)0x0);
  Mat::create(weight_data_tm,_w,num_input / elempack,num_output / out_elempack,
              (ulong)(uint)elempack * (ulong)(uint)out_elempack * 4,out_elempack * elempack,
              (Allocator *)0x0);
  if (out_elempack <= num_output) {
    sVar1 = weight_data_tm->cstep;
    sVar2 = weight_data_tm->elemsize;
    pvVar3 = weight_data_tm->data;
    uVar5 = 0;
    do {
      if (elempack <= num_input) {
        puVar4 = (undefined4 *)
                 ((long)(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff)
                             / (long)out_elempack) * sVar1 * sVar2 + (long)pvVar3);
        lVar8 = 0;
        do {
          if (0 < (int)_w) {
            lVar12 = 0;
            uVar7 = 0;
            do {
              if (0 < elempack) {
                puVar9 = (undefined4 *)
                         ((lVar8 * local_78.w + uVar5 * local_78.cstep) * local_78.elemsize + lVar12
                         + (long)local_78.data);
                uVar10 = 0;
                do {
                  puVar6 = puVar9;
                  uVar11 = (ulong)(uint)out_elempack;
                  if (0 < out_elempack) {
                    do {
                      *puVar4 = *puVar6;
                      puVar4 = puVar4 + 1;
                      puVar6 = (undefined4 *)((long)puVar6 + local_78.cstep * local_78.elemsize);
                      uVar11 = uVar11 - 1;
                    } while (uVar11 != 0);
                  }
                  uVar10 = uVar10 + 1;
                  puVar9 = (undefined4 *)((long)puVar9 + (long)local_78.w * local_78.elemsize);
                } while (uVar10 != (uint)elempack);
              }
              uVar7 = uVar7 + 1;
              lVar12 = lVar12 + 4;
            } while (uVar7 != _w);
          }
          lVar8 = lVar8 + elempack;
        } while (lVar8 < (long)num_input - (long)(elempack + -1));
      }
      uVar5 = uVar5 + (long)out_elempack;
    } while ((long)uVar5 < (long)num_output - (long)(out_elempack + -1));
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }
}